

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

xmlTextWriterPtr xmlNewTextWriterPushParser(xmlParserCtxtPtr ctxt,int compression)

{
  xmlOutputBufferPtr out;
  xmlTextWriterPtr pxVar1;
  char *pcVar2;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    pcVar2 = "xmlNewTextWriterPushParser : invalid context!\n";
  }
  else {
    out = xmlOutputBufferCreateIO
                    (xmlTextWriterWriteDocCallback,xmlTextWriterCloseDocCallback,ctxt,
                     (xmlCharEncodingHandlerPtr)0x0);
    if (out != (xmlOutputBufferPtr)0x0) {
      pxVar1 = xmlNewTextWriter(out);
      if (pxVar1 != (xmlTextWriterPtr)0x0) {
        pxVar1->ctxt = ctxt;
        return pxVar1;
      }
      xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (xmlNode *)0x0,0x19,1,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"%s","xmlNewTextWriterPushParser : error at xmlNewTextWriter!\n"
                   );
      xmlOutputBufferClose(out);
      return (xmlTextWriterPtr)0x0;
    }
    pcVar2 = "xmlNewTextWriterPushParser : error at xmlOutputBufferCreateIO!\n";
  }
  xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                (xmlNode *)0x0,0x19,1,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                (char *)0x0,0,0,"%s",pcVar2);
  return (xmlTextWriterPtr)0x0;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriterPushParser(xmlParserCtxtPtr ctxt,
                           int compression ATTRIBUTE_UNUSED)
{
    xmlTextWriterPtr ret;
    xmlOutputBufferPtr out;

    if (ctxt == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterPushParser : invalid context!\n");
        return NULL;
    }

    out = xmlOutputBufferCreateIO(xmlTextWriterWriteDocCallback,
                                  xmlTextWriterCloseDocCallback,
                                  (void *) ctxt, NULL);
    if (out == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterPushParser : error at xmlOutputBufferCreateIO!\n");
        return NULL;
    }

    ret = xmlNewTextWriter(out);
    if (ret == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterPushParser : error at xmlNewTextWriter!\n");
        xmlOutputBufferClose(out);
        return NULL;
    }

    ret->ctxt = ctxt;

    return ret;
}